

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

bool __thiscall Rml::Element::IsPointWithinElement(Element *this,Vector2f point)

{
  Vector2f VVar1;
  undefined8 uVar2;
  Vector2f VVar3;
  long lVar4;
  pointer pPVar5;
  Box *this_00;
  long lVar6;
  long lVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  
  UpdateAbsoluteOffsetAndRenderBoxData(this);
  pPVar5 = (this->additional_boxes).
           super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar8 = ((long)(this->additional_boxes).
                 super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5 & 0x2000000000U) == 0;
  if (bVar8) {
    VVar1 = this->absolute_offset;
    fStack_64 = point.y;
    lVar7 = -1;
    lVar6 = -0x40;
    do {
      if (lVar7 == -1) {
        fVar9 = 0.0;
        fVar10 = 0.0;
        this_00 = &this->main_box;
      }
      else {
        uVar2 = *(undefined8 *)((long)&(&pPVar5->box)[1].content + 8 + lVar6 + -8);
        fVar9 = (float)uVar2;
        fVar10 = (float)((ulong)uVar2 >> 0x20);
        this_00 = (Box *)((long)((pPVar5->box).area_edges + 0xffffffffffffffff) + 8U + lVar6);
      }
      local_58 = VVar1.x;
      fStack_54 = VVar1.y;
      VVar3 = Box::GetSize(this_00,Border);
      local_68 = point.x;
      if ((((local_58 + fVar9 <= local_68) && (local_68 <= local_58 + fVar9 + VVar3.x)) &&
          (fVar10 + fStack_54 <= fStack_64)) && (fStack_64 <= fVar10 + fStack_54 + VVar3.y)) {
        return bVar8;
      }
      pPVar5 = (this->additional_boxes).
               super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)(int)((ulong)((long)(this->additional_boxes).
                                        super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5)
                         >> 6);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x40;
      bVar8 = lVar7 < lVar4;
    } while (lVar7 < lVar4);
  }
  return bVar8;
}

Assistant:

bool Element::IsPointWithinElement(const Vector2f point)
{
	const Vector2f position = GetAbsoluteOffset(BoxArea::Border);

	for (int i = 0; i < GetNumBoxes(); ++i)
	{
		Vector2f box_offset;
		const Box& box = GetBox(i, box_offset);

		const Vector2f box_position = position + box_offset;
		const Vector2f box_dimensions = box.GetSize(BoxArea::Border);
		if (point.x >= box_position.x && point.x <= (box_position.x + box_dimensions.x) && point.y >= box_position.y &&
			point.y <= (box_position.y + box_dimensions.y))
		{
			return true;
		}
	}

	return false;
}